

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryLayeredRenderingTests.cpp
# Opt level: O3

bool vkt::geometry::anon_unknown_0::verifyImageSingleColoredRow
               (TestLog *log,ConstPixelBufferAccess *image,float rowWidthRatio,Vec4 *barColor)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined1 auVar2 [16];
  TestLog *pTVar3;
  int i;
  int iVar4;
  long lVar5;
  ConstPixelBufferAccess *access;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  bool bVar6;
  int iVar7;
  int z;
  int iVar8;
  bool bVar9;
  bool bVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  Vector<bool,_4> res;
  TextureLevel errorMask;
  PixelBufferAccess errorMaskAccess;
  Vec4 color;
  string local_480;
  string local_460;
  Vec4 *local_440;
  string local_438;
  string local_418;
  TextureFormat local_3f8;
  LogImageSet local_3f0;
  undefined1 local_3b0 [40];
  string local_388;
  string local_368;
  LogImage local_348;
  undefined1 local_2b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a8;
  _Alloc_hider local_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288 [6];
  Vec4 local_228;
  Vec4 local_218;
  TextureLevel local_208;
  PixelBufferAccess local_1e0;
  undefined1 local_1b8 [8];
  float fStack_1b0;
  float fStack_1ac;
  ios_base local_140 [272];
  
  local_218.m_data[0] = 0.0;
  local_218.m_data[1] = 1.0;
  local_218.m_data[2] = 0.0;
  local_218.m_data[3] = 1.0;
  local_228.m_data[0] = 1.0;
  local_228.m_data[1] = 0.0;
  local_228.m_data[2] = 0.0;
  local_228.m_data[3] = 1.0;
  iVar8 = (image->m_size).m_data[0];
  local_440 = barColor;
  tcu::TextureLevel::TextureLevel(&local_208,&image->m_format,iVar8,(image->m_size).m_data[1],1);
  tcu::TextureLevel::getAccess(&local_1e0,&local_208);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)local_1b8,&local_208);
  tcu::clear((PixelBufferAccess *)local_1b8,&local_218);
  local_1b8 = (undefined1  [8])log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&fStack_1b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&fStack_1b0,"Expecting all pixels with distance less or equal to (about) ",
             0x3c);
  iVar7 = (int)((float)iVar8 * rowWidthRatio);
  std::ostream::operator<<((ostringstream *)&fStack_1b0,iVar7);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&fStack_1b0," pixels from left border to be of color ",0x28);
  local_2b8._8_4_ = local_440->m_data[2];
  local_2b8._0_8_ = *(undefined8 *)local_440->m_data;
  tcu::operator<<((ostream *)&fStack_1b0,(Vector<float,_3> *)local_2b8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&fStack_1b0,".",1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fStack_1b0);
  std::ios_base::~ios_base(local_140);
  iVar8 = (image->m_size).m_data[1];
  if (0 < iVar8) {
    iVar4 = (image->m_size).m_data[0];
    bVar6 = true;
    z = 0;
    local_3f8 = (TextureFormat)log;
    do {
      if (0 < iVar4) {
        iVar8 = 0;
        do {
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)local_1b8,(int)image,iVar8,z);
          auVar15._0_8_ =
               CONCAT44((float)local_1b8._4_4_ + -0.0,(float)local_1b8._0_4_ + -0.0) ^
               0x8000000080000000;
          auVar15._8_4_ = -(fStack_1b0 + -0.0);
          auVar15._12_4_ = -(fStack_1ac + -1.0);
          auVar16._4_4_ = (float)local_1b8._4_4_ + -0.0;
          auVar16._0_4_ = (float)local_1b8._0_4_ + -0.0;
          auVar16._8_4_ = fStack_1b0 + -0.0;
          auVar16._12_4_ = fStack_1ac + -1.0;
          auVar16 = maxps(auVar15,auVar16);
          auVar17._4_4_ = -(uint)(auVar16._4_4_ < 0.02);
          auVar17._0_4_ = -(uint)(auVar16._0_4_ < 0.02);
          auVar17._8_4_ = -(uint)(auVar16._8_4_ < 0.02);
          auVar17._12_4_ = -(uint)(auVar16._12_4_ < 0.02);
          auVar16 = packssdw(auVar17,auVar17);
          auVar16 = packsswb(auVar16,auVar16);
          local_2b8._0_4_ = auVar16._0_4_ & (uint)DAT_00ac4030;
          local_348.m_name._M_dataplus._M_p._0_4_ = 0x1010101;
          bVar9 = true;
          lVar5 = 0;
          do {
            if (bVar9) {
              bVar9 = local_2b8[lVar5] == *(char *)((long)(&local_348.m_access.m_size + -6) + lVar5)
              ;
            }
            else {
              bVar9 = false;
            }
            lVar5 = lVar5 + 1;
          } while (lVar5 != 4);
          fVar11 = (float)local_1b8._0_4_ - local_440->m_data[0];
          fVar12 = (float)local_1b8._4_4_ - local_440->m_data[1];
          fVar13 = fStack_1b0 - local_440->m_data[2];
          fVar14 = fStack_1ac - local_440->m_data[3];
          auVar18._0_8_ = CONCAT44(fVar12,fVar11) ^ 0x8000000080000000;
          auVar18._8_4_ = -fVar13;
          auVar18._12_4_ = -fVar14;
          auVar2._4_4_ = fVar12;
          auVar2._0_4_ = fVar11;
          auVar2._8_4_ = fVar13;
          auVar2._12_4_ = fVar14;
          auVar16 = maxps(auVar18,auVar2);
          auVar19._4_4_ = -(uint)(auVar16._4_4_ < 0.02);
          auVar19._0_4_ = -(uint)(auVar16._0_4_ < 0.02);
          auVar19._8_4_ = -(uint)(auVar16._8_4_ < 0.02);
          auVar19._12_4_ = -(uint)(auVar16._12_4_ < 0.02);
          auVar16 = packssdw(auVar19,auVar19);
          auVar16 = packsswb(auVar16,auVar16);
          local_2b8._0_4_ = auVar16._0_4_ & (uint)DAT_00ac4030;
          local_348.m_name._M_dataplus._M_p._0_4_ = 0x1010101;
          bVar10 = true;
          lVar5 = 0;
          do {
            if (bVar10) {
              bVar10 = local_2b8[lVar5] ==
                       *(char *)((long)(&local_348.m_access.m_size + -6) + lVar5);
            }
            else {
              bVar10 = false;
            }
            lVar5 = lVar5 + 1;
          } while (lVar5 != 4);
          if (iVar7 + -1 < iVar8) {
            bVar10 = (bool)(bVar9 | iVar8 < iVar7 + 1 & bVar10);
          }
          if (!bVar10) {
            tcu::PixelBufferAccess::setPixel(&local_1e0,&local_228,iVar8,z,0);
          }
          bVar6 = (bool)(bVar6 & bVar10);
          iVar8 = iVar8 + 1;
          iVar4 = (image->m_size).m_data[0];
        } while (iVar8 < iVar4);
        iVar8 = (image->m_size).m_data[1];
      }
      z = z + 1;
    } while (z < iVar8);
    log = (TestLog *)local_3f8;
    if (!bVar6) {
      local_1b8._0_4_ = local_3f8.order;
      local_1b8._4_4_ = local_3f8.type;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&fStack_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&fStack_1b0,"Image verification failed. Got unexpected pixels.",0x31);
      pTVar3 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"LayerContent","");
      local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_480,"Layer content","");
      tcu::LogImageSet::LogImageSet(&local_3f0,&local_460,&local_480);
      tcu::TestLog::startImageSet
                (pTVar3,local_3f0.m_name._M_dataplus._M_p,local_3f0.m_description._M_dataplus._M_p);
      local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"Layer","");
      local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"Layer","");
      tcu::LogImage::LogImage
                ((LogImage *)local_2b8,&local_418,&local_438,image,QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)local_2b8,(int)pTVar3,__buf_00,(size_t)image);
      local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"ErrorMask","");
      local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"Errors","");
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                ((ConstPixelBufferAccess *)local_3b0,&local_208);
      access = (ConstPixelBufferAccess *)local_3b0;
      tcu::LogImage::LogImage
                (&local_348,&local_368,&local_388,access,QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write(&local_348,(int)pTVar3,__buf_01,(size_t)access);
      tcu::TestLog::endImageSet(pTVar3);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_348.m_description._M_dataplus._M_p != &local_348.m_description.field_2) {
        operator_delete(local_348.m_description._M_dataplus._M_p,
                        local_348.m_description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_348.m_name._M_dataplus._M_p._4_4_,
                      local_348.m_name._M_dataplus._M_p._0_4_) != &local_348.m_name.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_348.m_name._M_dataplus._M_p._4_4_,
                                 local_348.m_name._M_dataplus._M_p._0_4_),
                        local_348.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_388._M_dataplus._M_p != &local_388.field_2) {
        operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_368._M_dataplus._M_p != &local_368.field_2) {
        operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_p != local_288) {
        operator_delete(local_298._M_p,local_288[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._0_8_ != &local_2a8) {
        operator_delete((void *)local_2b8._0_8_,local_2a8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_438._M_dataplus._M_p != &local_438.field_2) {
        operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_418._M_dataplus._M_p != &local_418.field_2) {
        operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f0.m_description._M_dataplus._M_p != &local_3f0.m_description.field_2) {
        operator_delete(local_3f0.m_description._M_dataplus._M_p,
                        local_3f0.m_description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f0.m_name._M_dataplus._M_p != &local_3f0.m_name.field_2) {
        operator_delete(local_3f0.m_name._M_dataplus._M_p,
                        local_3f0.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_480._M_dataplus._M_p != &local_480.field_2) {
        operator_delete(local_480._M_dataplus._M_p,local_480.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_460._M_dataplus._M_p != &local_460.field_2) {
        operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fStack_1b0);
      std::ios_base::~ios_base(local_140);
      bVar6 = false;
      goto LAB_009e8aa8;
    }
  }
  local_1b8 = (undefined1  [8])log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&fStack_1b0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&fStack_1b0,"Image is valid.",0xf);
  pTVar3 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  paVar1 = &local_3f0.m_name.field_2;
  local_3f0.m_name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"LayerContent","");
  local_3b0._0_8_ = (long)local_3b0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"Layer content","");
  tcu::LogImageSet::LogImageSet((LogImageSet *)&local_348,&local_3f0.m_name,(string *)local_3b0);
  tcu::TestLog::startImageSet
            (pTVar3,(char *)CONCAT44(local_348.m_name._M_dataplus._M_p._4_4_,
                                     local_348.m_name._M_dataplus._M_p._0_4_),
             local_348.m_description._M_dataplus._M_p);
  local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"Layer","");
  local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_480,"Layer","");
  tcu::LogImage::LogImage
            ((LogImage *)local_2b8,&local_460,&local_480,image,QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write((LogImage *)local_2b8,(int)pTVar3,__buf,(size_t)image);
  tcu::TestLog::endImageSet(pTVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_p != local_288) {
    operator_delete(local_298._M_p,local_288[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._0_8_ != &local_2a8) {
    operator_delete((void *)local_2b8._0_8_,local_2a8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_480._M_dataplus._M_p != &local_480.field_2) {
    operator_delete(local_480._M_dataplus._M_p,local_480.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_460._M_dataplus._M_p != &local_460.field_2) {
    operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348.m_description._M_dataplus._M_p != &local_348.m_description.field_2) {
    operator_delete(local_348.m_description._M_dataplus._M_p,
                    local_348.m_description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_348.m_name._M_dataplus._M_p._4_4_,local_348.m_name._M_dataplus._M_p._0_4_)
      != &local_348.m_name.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_348.m_name._M_dataplus._M_p._4_4_,
                             local_348.m_name._M_dataplus._M_p._0_4_),
                    local_348.m_name.field_2._M_allocated_capacity + 1);
  }
  if (local_3b0._0_8_ != (long)local_3b0 + 0x10) {
    operator_delete((void *)local_3b0._0_8_,local_3b0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_3f0.m_name._M_dataplus._M_p,
                    local_3f0.m_name.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fStack_1b0);
  std::ios_base::~ios_base(local_140);
  bVar6 = true;
LAB_009e8aa8:
  tcu::TextureLevel::~TextureLevel(&local_208);
  return bVar6;
}

Assistant:

bool verifyImageSingleColoredRow (tcu::TestLog& log, const tcu::ConstPixelBufferAccess image, const float rowWidthRatio, const tcu::Vec4& barColor)
{
	DE_ASSERT(rowWidthRatio > 0.0f);

	const Vec4				black				(0.0f, 0.0f, 0.0f, 1.0f);
	const Vec4				green				(0.0f, 1.0f, 0.0f, 1.0f);
	const Vec4				red					(1.0f, 0.0f, 0.0f, 1.0f);
	const Vec4				threshold			(0.02f);
	const int				barLength			= static_cast<int>(rowWidthRatio * static_cast<float>(image.getWidth()));
	const int				barLengthThreshold	= 1;
	tcu::TextureLevel		errorMask			(image.getFormat(), image.getWidth(), image.getHeight());
	tcu::PixelBufferAccess	errorMaskAccess		= errorMask.getAccess();

	tcu::clear(errorMask.getAccess(), green);

	log << tcu::TestLog::Message
		<< "Expecting all pixels with distance less or equal to (about) " << barLength
		<< " pixels from left border to be of color " << barColor.swizzle(0, 1, 2) << "."
		<< tcu::TestLog::EndMessage;

	bool allPixelsOk = true;

	for (int y = 0; y < image.getHeight(); ++y)
	for (int x = 0; x < image.getWidth();  ++x)
	{
		const Vec4	color		= image.getPixel(x, y);
		const bool	isBlack		= compareColors(color, black, threshold);
		const bool	isColor		= compareColors(color, barColor, threshold);

		bool isOk;

		if (x <= barLength - barLengthThreshold)
			isOk = isColor;
		else if (x >= barLength + barLengthThreshold)
			isOk = isBlack;
		else
			isOk = isColor || isBlack;

		allPixelsOk &= isOk;

		if (!isOk)
			errorMaskAccess.setPixel(red, x, y);
	}

	if (allPixelsOk)
	{
		log << tcu::TestLog::Message << "Image is valid." << tcu::TestLog::EndMessage
			<< tcu::TestLog::ImageSet("LayerContent", "Layer content")
			<< tcu::TestLog::Image("Layer", "Layer", image)
			<< tcu::TestLog::EndImageSet;
		return true;
	}
	else
	{
		log << tcu::TestLog::Message << "Image verification failed. Got unexpected pixels." << tcu::TestLog::EndMessage
			<< tcu::TestLog::ImageSet("LayerContent", "Layer content")
			<< tcu::TestLog::Image("Layer",		"Layer",	image)
			<< tcu::TestLog::Image("ErrorMask",	"Errors",	errorMask)
			<< tcu::TestLog::EndImageSet;
		return false;
	}

	log << tcu::TestLog::Image("LayerContent", "Layer content", image);

	return allPixelsOk;
}